

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jdatasrc-tj.c
# Opt level: O0

void jpeg_mem_src_tj(j_decompress_ptr cinfo,uchar *inbuffer,unsigned_long insize)

{
  long *plVar1;
  long lVar2;
  long in_RDX;
  long in_RSI;
  long *in_RDI;
  jpeg_source_mgr *src;
  
  if ((in_RSI == 0) || (in_RDX == 0)) {
    *(undefined4 *)(*in_RDI + 0x28) = 0x2a;
    (**(code **)*in_RDI)(in_RDI);
  }
  if (in_RDI[5] == 0) {
    lVar2 = (**(code **)in_RDI[1])(in_RDI,0,0x38);
    in_RDI[5] = lVar2;
  }
  else if (*(code **)(in_RDI[5] + 0x10) != init_mem_source) {
    *(undefined4 *)(*in_RDI + 0x28) = 0x17;
    (**(code **)*in_RDI)(in_RDI);
  }
  plVar1 = (long *)in_RDI[5];
  plVar1[2] = (long)init_mem_source;
  plVar1[3] = (long)fill_mem_input_buffer;
  plVar1[4] = (long)skip_input_data;
  plVar1[5] = (long)jpeg_resync_to_restart;
  plVar1[6] = (long)term_source;
  plVar1[1] = in_RDX;
  *plVar1 = in_RSI;
  return;
}

Assistant:

GLOBAL(void)
jpeg_mem_src_tj(j_decompress_ptr cinfo, const unsigned char *inbuffer,
                unsigned long insize)
{
  struct jpeg_source_mgr *src;

  if (inbuffer == NULL || insize == 0)  /* Treat empty input as fatal error */
    ERREXIT(cinfo, JERR_INPUT_EMPTY);

  /* The source object is made permanent so that a series of JPEG images
   * can be read from the same buffer by calling jpeg_mem_src only before
   * the first one.
   */
  if (cinfo->src == NULL) {     /* first time for this JPEG object? */
    cinfo->src = (struct jpeg_source_mgr *)
      (*cinfo->mem->alloc_small) ((j_common_ptr)cinfo, JPOOL_PERMANENT,
                                  sizeof(struct jpeg_source_mgr));
  } else if (cinfo->src->init_source != init_mem_source) {
    /* It is unsafe to reuse the existing source manager unless it was created
     * by this function.
     */
    ERREXIT(cinfo, JERR_BUFFER_SIZE);
  }

  src = cinfo->src;
  src->init_source = init_mem_source;
  src->fill_input_buffer = fill_mem_input_buffer;
  src->skip_input_data = skip_input_data;
  src->resync_to_restart = jpeg_resync_to_restart; /* use default method */
  src->term_source = term_source;
  src->bytes_in_buffer = (size_t)insize;
  src->next_input_byte = (const JOCTET *)inbuffer;
}